

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
sfc::mirror<unsigned_char>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,uint width,bool horizontal,
          bool vertical)

{
  size_type sVar1;
  runtime_error *this;
  reference __x;
  uint local_80;
  uint local_7c;
  uint column;
  int row_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mv;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  uchar *local_50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  uint local_38;
  uint row;
  uint local_24;
  undefined1 local_1f;
  byte local_1e;
  byte local_1d;
  uint height;
  bool vertical_local;
  bool horizontal_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_18;
  uint width_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *source_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *m;
  
  local_1f = 0;
  local_1e = vertical;
  local_1d = horizontal;
  height = width;
  pvStack_18 = source;
  source_local = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__,source);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_18);
  local_24 = (uint)(sVar1 / height);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_18);
  if ((sVar1 % (ulong)height == 0) &&
     (sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_18),
     sVar1 == height * local_24)) {
    if ((local_1d & 1) != 0) {
      for (local_38 = 0; local_38 < local_24; local_38 = local_38 + 1) {
        local_48._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                (__return_storage_ptr__);
        local_40 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator+(&local_48,(ulong)(local_38 * height));
        mv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                (__return_storage_ptr__);
        local_58 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&mv.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(local_38 * height));
        local_50 = (uchar *)__gnu_cxx::
                            __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::operator+(&local_58,(ulong)height);
        std::
        reverse<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (local_40,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             )local_50);
      }
    }
    if ((local_1e & 1) != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&column);
      local_7c = local_24;
      while (local_7c = local_7c - 1, -1 < (int)local_7c) {
        for (local_80 = 0; local_80 < height; local_80 = local_80 + 1) {
          __x = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (__return_storage_ptr__,(ulong)(local_7c * height + local_80));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&column,__x);
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (__return_storage_ptr__,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&column);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&column);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Can\'t mirror non-square image vector");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline std::vector<T> mirror(const std::vector<T>& source, unsigned width, bool horizontal, bool vertical) {
  auto m = source;
  unsigned height = (unsigned)(source.size() / width);
  if ((source.size() % width != 0) || (source.size() != width * height))
    throw std::runtime_error("Can't mirror non-square image vector");

  if (horizontal) {
    for (unsigned row = 0; row < height; ++row)
      std::reverse(m.begin() + (row * width), m.begin() + (row * width) + width);
  }

  if (vertical) {
    std::vector<T> mv;
    for (int row = height - 1; row >= 0; --row) {
      for (unsigned column = 0; column < width; ++column)
        mv.push_back(m[(row * width) + column]);
    }
    m = mv;
  }

  return m;
}